

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_integer<std::vector<char,std::allocator<char>>>
          (result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  const_iterator l;
  source_ptr *psVar1;
  char cVar2;
  const_iterator f;
  int iVar3;
  value_type *pvVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX;
  detail *ctx;
  pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> *this_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  allocator_type local_2da;
  allocator<char> local_2d9;
  string str;
  integer retval;
  pointer pbStack_2b0;
  pointer local_2a8;
  location<std::vector<char,_std::allocator<char>_>_> *local_298;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> local_240;
  pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> local_1f0;
  istringstream iss;
  region<std::vector<char,_std::allocator<char>_>_> local_198 [5];
  
  f._M_current = *(char **)(this + 0x40);
  local_298 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
  if ((f._M_current != *(char **)(*(long *)(this + 8) + 8)) && (*f._M_current == '0')) {
    l._M_current = f._M_current + 1;
    if (l._M_current == *(char **)(*(long *)(this + 8) + 8)) {
      region<std::vector<char,_std::allocator<char>_>_>::region
                ((region<std::vector<char,_std::allocator<char>_>_> *)&local_240,
                 (location<std::vector<char,_std::allocator<char>_>_> *)this,
                 (const_iterator)f._M_current,l);
      token._0_8_ = token._0_8_ & 0xffffffff00000000;
      region<std::vector<char,_std::allocator<char>_>_>::region
                (&token.field_1.succ.value,
                 (region<std::vector<char,_std::allocator<char>_>_> *)&local_240);
      std::pair<int,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::pair
                ((pair<int,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> *)&iss
                 ,(pair<int,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> *)
                  &token);
      result<std::pair<long,toml::detail::region<std::vector<char,std::allocator<char>>>>,std::__cxx11::string>
      ::result<std::pair<int,toml::detail::region<std::vector<char,std::allocator<char>>>>>
                ((result<std::pair<long,toml::detail::region<std::vector<char,std::allocator<char>>>>,std::__cxx11::string>
                  *)__return_storage_ptr__,
                 (success<std::pair<int,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
                  *)&iss);
      region<std::vector<char,_std::allocator<char>_>_>::~region(local_198);
      region<std::vector<char,_std::allocator<char>_>_>::~region(&token.field_1.succ.value);
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)&local_240);
      return __return_storage_ptr__;
    }
    cVar2 = *l._M_current;
    if (cVar2 == 'x') {
      parse_hexadecimal_integer<std::vector<char,std::allocator<char>>>
                (__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar2 == 'o') {
      parse_octal_integer<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if (cVar2 == 'b') {
      parse_binary_integer<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,this,loc);
      return __return_storage_ptr__;
    }
    if ((int)cVar2 - 0x30U < 10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,
                 "[error] toml::parse_integer: leading zero in an Integer is not allowed.",
                 &local_2d9);
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[13],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iss,&local_298,(char (*) [13])0x134568);
      __l._M_len = 1;
      __l._M_array = (iterator)&iss;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&str,__l,&local_2da);
      retval = 0;
      pbStack_2b0 = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      format_underline((string *)&local_240,(string *)&local_1f0,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&retval);
      goto LAB_0011a577;
    }
    iVar3 = isalpha((int)cVar2);
    loc = extraout_RDX;
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,
                 "[error] toml::parse_integer: unknown integer prefix appeared.",&local_2d9);
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[19],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iss,&local_298,(char (*) [19])"none of 0x, 0o, 0b");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&iss;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&str,__l_00,&local_2da);
      retval = 0;
      pbStack_2b0 = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      format_underline((string *)&local_240,(string *)&local_1f0,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&retval);
      goto LAB_0011a577;
    }
  }
  ctx = this;
  sequence<toml::detail::maybe<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>>,toml::detail::either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&token,(sequence<toml::detail::maybe<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>>,toml::detail::either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>>
                     *)this,loc);
  if (token.is_ok_ == true) {
    pvVar4 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&token);
    region<std::vector<char,std::allocator<char>>>::str_abi_cxx11_(&str,pvVar4);
    iss = (istringstream)0x5f;
    _Var5 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)&iss);
    std::__cxx11::string::erase(&str,_Var5._M_current,str._M_dataplus._M_p + str._M_string_length);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&str,_S_in);
    retval = 0;
    std::istream::_M_extract<long>((long *)&iss);
    pvVar4 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&token);
    local_1f0.first = retval;
    region<std::vector<char,_std::allocator<char>_>_>::region(&local_1f0.second,pvVar4);
    this_00 = &local_240;
    std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::pair
              (this_00,&local_1f0);
    result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(success_type *)this_00);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_240.second);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_1f0.second);
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    std::__cxx11::string::~string((string *)&str);
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    cleanup(&token,(EVP_PKEY_CTX *)this_00);
    return __return_storage_ptr__;
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  cleanup(&token,(EVP_PKEY_CTX *)ctx);
  location<std::vector<char,_std::allocator<char>_>_>::reset
            ((location<std::vector<char,_std::allocator<char>_>_> *)this,f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"[error] toml::parse_integer: ",&local_2d9);
  std::
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[33],_true>
            ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iss,&local_298,(char (*) [33])"the next token is not an integer");
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&iss;
  std::
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&str,__l_01,&local_2da);
  retval = 0;
  pbStack_2b0 = (pointer)0x0;
  local_2a8 = (pointer)0x0;
  format_underline((string *)&local_240,(string *)&local_1f0,
                   (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&retval);
LAB_0011a577:
  token._0_8_ = (long)&token.field_1 + 8;
  psVar1 = &local_240.second.source_;
  if ((source_ptr *)local_240.first == psVar1) {
    token.field_1.succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         local_240.second.source_.
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  }
  else {
    token._0_8_ = local_240.first;
  }
  token.field_1.succ.value.super_region_base._vptr_region_base =
       (region_base)(region_base)local_240.second.super_region_base._vptr_region_base;
  local_240.second.super_region_base._vptr_region_base = (_func_int **)0x0;
  local_240.second.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_1_ = 0;
  local_240.first = (long)psVar1;
  result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::result(__return_storage_ptr__,(failure_type *)&token);
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::string::~string((string *)&local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&retval);
  std::
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&str);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)&local_1f0);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<integer, region<Container>>, std::string>
parse_integer(location<Container>& loc)
{
    const auto first = loc.iter();
    if(first != loc.end() && *first == '0')
    {
        const auto second = std::next(first);
        if(second == loc.end()) // the token is just zero.
        {
            return ok(std::make_pair(0, region<Container>(loc, first, second)));
        }

        if(*second == 'b') {return parse_binary_integer     (loc);} // 0b1100
        if(*second == 'o') {return parse_octal_integer      (loc);} // 0o775
        if(*second == 'x') {return parse_hexadecimal_integer(loc);} // 0xC0FFEE

        if(std::isdigit(*second))
        {
            return err(format_underline("[error] toml::parse_integer: "
                "leading zero in an Integer is not allowed.",
                {{std::addressof(loc), "leading zero"}}));
        }
        else if(std::isalpha(*second))
        {
             return err(format_underline("[error] toml::parse_integer: "
                "unknown integer prefix appeared.",
                {{std::addressof(loc), "none of 0x, 0o, 0b"}}));
        }
    }

    if(const auto token = lex_dec_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

        std::istringstream iss(str);
        integer retval(0);
        iss >> retval;
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("[error] toml::parse_integer: ",
               {{std::addressof(loc), "the next token is not an integer"}}));
}